

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureAllocARGB(WebPPicture *picture)

{
  int iVar1;
  void *pvVar2;
  WebPPicture *in_RDI;
  uint64_t argb_size;
  int height;
  int width;
  void *memory;
  int iVar3;
  int iVar4;
  uint64_t in_stack_ffffffffffffffe8;
  int local_4;
  
  iVar4 = in_RDI->width;
  iVar3 = in_RDI->height;
  iVar1 = WebPValidatePicture((WebPPicture *)((long)iVar4 * (long)iVar3));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    WebPSafeFree((void *)0x156020);
    WebPPictureResetBufferARGB(in_RDI);
    pvVar2 = WebPSafeMalloc(in_stack_ffffffffffffffe8,CONCAT44(iVar4,iVar3));
    if (pvVar2 == (void *)0x0) {
      local_4 = WebPEncodingSetError(in_RDI,VP8_ENC_ERROR_OUT_OF_MEMORY);
    }
    else {
      in_RDI->memory_argb_ = pvVar2;
      in_RDI->argb = (uint32_t *)((long)pvVar2 + 0x1fU & 0xffffffffffffffe0);
      in_RDI->argb_stride = iVar4;
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int WebPPictureAllocARGB(WebPPicture* const picture) {
  void* memory;
  const int width = picture->width;
  const int height = picture->height;
  const uint64_t argb_size = (uint64_t)width * height;

  if (!WebPValidatePicture(picture)) return 0;

  WebPSafeFree(picture->memory_argb_);
  WebPPictureResetBufferARGB(picture);

  // allocate a new buffer.
  memory = WebPSafeMalloc(argb_size + WEBP_ALIGN_CST, sizeof(*picture->argb));
  if (memory == NULL) {
    return WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  picture->memory_argb_ = memory;
  picture->argb = (uint32_t*)WEBP_ALIGN(memory);
  picture->argb_stride = width;
  return 1;
}